

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

LongLong __thiscall fmt::File::size(File *this)

{
  int iVar1;
  undefined8 uVar2;
  int *in_RDI;
  Stat file_stat;
  int in_stack_ffffffffffffff64;
  SystemError *in_stack_ffffffffffffff68;
  CStringRef in_stack_ffffffffffffff70;
  LongLong local_68;
  
  memset(&stack0xffffffffffffff68,0,0x90);
  iVar1 = fstat(*in_RDI,(stat *)&stack0xffffffffffffff68);
  if (iVar1 == -1) {
    uVar2 = __cxa_allocate_exception(0x18);
    __errno_location();
    BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffff60,"cannot get file attributes");
    SystemError::SystemError
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff70);
    __cxa_throw(uVar2,&SystemError::typeinfo,SystemError::~SystemError);
  }
  return local_68;
}

Assistant:

fmt::LongLong fmt::File::size() const {
#ifdef _WIN32
  // Use GetFileSize instead of GetFileSizeEx for the case when _WIN32_WINNT
  // is less than 0x0500 as is the case with some default MinGW builds.
  // Both functions support large file sizes.
  DWORD size_upper = 0;
  HANDLE handle = reinterpret_cast<HANDLE>(_get_osfhandle(fd_));
  DWORD size_lower = FMT_SYSTEM(GetFileSize(handle, &size_upper));
  if (size_lower == INVALID_FILE_SIZE) {
    DWORD error = GetLastError();
    if (error != NO_ERROR)
      FMT_THROW(WindowsError(GetLastError(), "cannot get file size"));
  }
  fmt::ULongLong long_size = size_upper;
  return (long_size << sizeof(DWORD) * CHAR_BIT) | size_lower;
#else
  typedef struct stat Stat;
  Stat file_stat = Stat();
  if (FMT_POSIX_CALL(fstat(fd_, &file_stat)) == -1)
    FMT_THROW(SystemError(errno, "cannot get file attributes"));
  FMT_STATIC_ASSERT(sizeof(fmt::LongLong) >= sizeof(file_stat.st_size),
      "return type of File::size is not large enough");
  return file_stat.st_size;
#endif
}